

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O1

void __thiscall OpenMD::TetrahedralityHBMatrix::process(TetrahedralityHBMatrix *this)

{
  double *pdVar1;
  char cVar2;
  int iVar3;
  SimInfo *pSVar4;
  pointer pdVar5;
  double dVar6;
  pointer pOVar7;
  pair<double,_OpenMD::Molecule_*> *ppVar8;
  uint i;
  Molecule *pMVar9;
  Molecule *pMVar10;
  ulong uVar11;
  HBondDonor *pHVar12;
  Atom *pAVar13;
  long lVar14;
  pointer ppAVar15;
  pointer ppHVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  double tmp;
  double dVar20;
  Vector<double,_3U> result;
  int ii;
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  myNeighbors;
  Vector3d DH;
  int jj;
  Vector3d DA;
  Vector3d HA;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Vector3d rkj;
  Vector3d rik;
  MoleculeIterator mi;
  Vector3d rk;
  Vector3d vec;
  Vector3d rj;
  Vector3d ri;
  DumpReader reader;
  SelectionSet local_14c8;
  pair<double,_OpenMD::Molecule_*> *local_14b0;
  pointer local_14a8;
  double local_14a0;
  int local_1494;
  SelectionManager *local_1490;
  pair<double,_OpenMD::Molecule_*> *local_1488;
  iterator iStack_1480;
  pair<double,_OpenMD::Molecule_*> *local_1478;
  ulong local_1468;
  int local_145c;
  Vector3d local_1458;
  int local_1440;
  int local_143c;
  Vector3d local_1438;
  Vector3d local_1418;
  double local_13f8 [4];
  double local_13d8 [4];
  double local_13b8 [4];
  Vector3d local_1398;
  Vector3d local_1378;
  vector<double,_std::allocator<double>_> *local_1358;
  MoleculeIterator local_1350;
  pointer local_1348;
  Molecule *pMStack_1340;
  pointer local_1338;
  Vector3d local_1328;
  SelectionEvaluator *local_1308;
  long local_1300;
  pointer local_12f8;
  Molecule *pMStack_12f0;
  pointer local_12e8;
  pointer local_12d8;
  Molecule *pMStack_12d0;
  pointer local_12c8;
  Vector3d local_12b8;
  Vector3d local_12a0;
  DumpReader local_1288;
  
  local_1350._M_node = (_Base_ptr)0x0;
  local_1328.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1328.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1328.super_Vector<double,_3U>.data_[1] = 0.0;
  local_12c8 = (pointer)0x0;
  local_12d8 = (pointer)0x0;
  pMStack_12d0 = (Molecule *)0x0;
  local_12e8 = (pointer)0x0;
  local_12f8 = (pointer)0x0;
  pMStack_12f0 = (Molecule *)0x0;
  local_1338 = (pointer)0x0;
  local_1348 = (pointer)0x0;
  pMStack_1340 = (Molecule *)0x0;
  local_1378.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1378.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1378.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[1] = 0.0;
  local_13b8[2] = 0.0;
  local_13b8[0] = 0.0;
  local_13b8[1] = 0.0;
  local_13d8[2] = 0.0;
  local_13d8[0] = 0.0;
  local_13d8[1] = 0.0;
  local_13f8[2] = 0.0;
  local_13f8[0] = 0.0;
  local_13f8[1] = 0.0;
  local_1458.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1458.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1458.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1438.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1438.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1438.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1418.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1418.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1418.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1478 = (pair<double,_OpenMD::Molecule_*> *)0x0;
  local_1488 = (pair<double,_OpenMD::Molecule_*> *)0x0;
  iStack_1480._M_current = (pair<double,_OpenMD::Molecule_*> *)0x0;
  pSVar4 = (this->super_StaticAnalyser).info_;
  cVar2 = (pSVar4->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,pSVar4,&(this->super_StaticAnalyser).dumpFilename_);
  local_1440 = DumpReader::getNFrames(&local_1288);
  if (0 < local_1440) {
    local_1358 = &this->Q_;
    local_1308 = &this->evaluator_;
    local_1490 = &this->seleMan_;
    uVar18 = 0;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar18);
      pSVar4 = (this->super_StaticAnalyser).info_;
      this->currentSnapshot_ = pSVar4->sman_->currentSnapshot_;
      pdVar5 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar5) {
        (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar5;
      }
      local_14c8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (local_1358,(long)pSVar4->nGlobalMols_,(value_type_conflict2 *)&local_14c8);
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_14c8,local_1308);
        lVar19 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar19),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_14c8.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar19));
          lVar19 = lVar19 + 0x28;
        } while (lVar19 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_14c8.bitsets_);
      }
      pMVar9 = SelectionManager::beginSelectedMolecule(local_1490,&local_1494);
      local_1468 = uVar18;
      while (pMVar9 != (Molecule *)0x0) {
        iVar3 = pMVar9->globalIndex_;
        if (iStack_1480._M_current != local_1488) {
          iStack_1480._M_current = local_1488;
        }
        pMVar10 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&local_1350);
        while (ppVar8 = local_1488, pMVar10 != (Molecule *)0x0) {
          if (pMVar10->globalIndex_ != iVar3) {
            Molecule::getCom(&local_12a0,pMVar9);
            Molecule::getCom(&local_12b8,pMVar10);
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar19 = 0;
            do {
              (&local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                   (pointer)(local_12a0.super_Vector<double,_3U>.data_[lVar19] -
                            local_12b8.super_Vector<double,_3U>.data_[lVar19]);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_1328.super_Vector<double,_3U>.data_[2] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1328.super_Vector<double,_3U>.data_[0] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1328.super_Vector<double,_3U>.data_[1] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar2 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_1328);
            }
            dVar6 = 0.0;
            lVar19 = 0;
            do {
              dVar20 = local_1328.super_Vector<double,_3U>.data_[lVar19];
              dVar6 = dVar6 + dVar20 * dVar20;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (dVar6 < 0.0) {
              pOVar7 = (pointer)sqrt(dVar6);
            }
            else {
              pOVar7 = (pointer)SQRT(dVar6);
            }
            if ((double)pOVar7 < this->rCut_) {
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = pOVar7;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar10;
              if (iStack_1480._M_current == local_1478) {
                std::
                vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>
                ::_M_realloc_insert<std::pair<double,OpenMD::Molecule*>>
                          ((vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>
                            *)&local_1488,iStack_1480,
                           (pair<double,_OpenMD::Molecule_*> *)&local_14c8);
              }
              else {
                (iStack_1480._M_current)->first = (double)pOVar7;
                (iStack_1480._M_current)->second = pMVar10;
                iStack_1480._M_current = iStack_1480._M_current + 1;
              }
            }
          }
          pMVar10 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&local_1350);
        }
        if (local_1488 != iStack_1480._M_current) {
          uVar11 = (long)iStack_1480._M_current - (long)local_1488 >> 4;
          lVar19 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          local_14b0 = iStack_1480._M_current;
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::Molecule*>*,std::vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_1488,iStack_1480._M_current,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::Molecule*>*,std::vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar8,local_14b0);
        }
        uVar17 = (uint)((ulong)((long)iStack_1480._M_current - (long)local_1488) >> 4);
        local_14b0 = (pair<double,_OpenMD::Molecule_*> *)
                     ((double)(int)((uVar17 - 1) * uVar17) * 0.5);
        local_1300 = (long)iVar3;
        Molecule::getCom((Vector3d *)&local_14c8,pMVar9);
        local_145c = (int)(double)local_14b0;
        local_1338 = local_14c8.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1348 = local_14c8.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        pMStack_1340 = (Molecule *)
                       local_14c8.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        local_14b0 = (pair<double,_OpenMD::Molecule_*> *)0x3ff0000000000000;
        if (1 < (int)uVar17) {
          local_14a0 = (double)local_145c * 4.0;
          local_14a8 = (pointer)(ulong)(uVar17 - 1);
          uVar11 = 1;
          ppAVar15 = (pointer)0x0;
          local_14b0 = (pair<double,_OpenMD::Molecule_*> *)0x3ff0000000000000;
          do {
            Molecule::getCom((Vector3d *)&local_14c8,local_1488[(long)ppAVar15].second);
            local_12c8 = local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_12d8 = local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pMStack_12d0 = (Molecule *)
                           local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar19 = 0;
            do {
              (&local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                   (pointer)((double)(&local_1348)[lVar19] - (double)(&local_12d8)[lVar19]);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_1378.super_Vector<double,_3U>.data_[2] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1378.super_Vector<double,_3U>.data_[0] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1378.super_Vector<double,_3U>.data_[1] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar2 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_1378);
            }
            dVar6 = 0.0;
            lVar19 = 0;
            do {
              dVar20 = local_1378.super_Vector<double,_3U>.data_[lVar19];
              dVar6 = dVar6 + dVar20 * dVar20;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (dVar6 < 0.0) {
              dVar6 = sqrt(dVar6);
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            lVar19 = 0;
            do {
              local_1378.super_Vector<double,_3U>.data_[lVar19] =
                   local_1378.super_Vector<double,_3U>.data_[lVar19] / dVar6;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            ppAVar15 = (pointer)((long)ppAVar15 + 1);
            uVar18 = uVar11;
            do {
              Molecule::getCom((Vector3d *)&local_14c8,local_1488[uVar18].second);
              local_12e8 = local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_12f8 = local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              pMStack_12f0 = (Molecule *)
                             local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar19 = 0;
              do {
                (&local_14c8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                     (pointer)((double)(&local_1348)[lVar19] - (double)(&local_12f8)[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_1398.super_Vector<double,_3U>.data_[2] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1398.super_Vector<double,_3U>.data_[0] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_1398.super_Vector<double,_3U>.data_[1] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              if (cVar2 != '\0') {
                Snapshot::wrapVector(this->currentSnapshot_,&local_1398);
              }
              dVar6 = 0.0;
              lVar19 = 0;
              do {
                dVar20 = local_1398.super_Vector<double,_3U>.data_[lVar19];
                dVar6 = dVar6 + dVar20 * dVar20;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              lVar19 = 0;
              do {
                local_1398.super_Vector<double,_3U>.data_[lVar19] =
                     local_1398.super_Vector<double,_3U>.data_[lVar19] / dVar6;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              dVar6 = 0.0;
              lVar19 = 0;
              do {
                dVar6 = dVar6 + local_1378.super_Vector<double,_3U>.data_[lVar19] *
                                local_1398.super_Vector<double,_3U>.data_[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_14b0 = (pair<double,_OpenMD::Molecule_*> *)
                           ((double)local_14b0 +
                           ((dVar6 + 0.3333333333333333) * (dVar6 + 0.3333333333333333) * -9.0) /
                           local_14a0);
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uVar17 & 0x7fffffff));
            uVar11 = uVar11 + 1;
            uVar18 = local_1468;
          } while (ppAVar15 != local_14a8);
        }
        if (0 < local_145c) {
          (local_1358->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[local_1300] = (double)local_14b0;
        }
        pMVar9 = SelectionManager::nextSelectedMolecule(local_1490,&local_1494);
      }
      pMVar9 = SelectionManager::beginSelectedMolecule(local_1490,&local_1494);
      while (pMVar9 != (Molecule *)0x0) {
        pMVar10 = SelectionManager::beginSelectedMolecule(local_1490,&local_143c);
        while (pMVar10 != (Molecule *)0x0) {
          ppHVar16 = (pMVar9->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppHVar16 ==
              (pMVar9->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pHVar12 = (HBondDonor *)0x0;
          }
          else {
            pHVar12 = *ppHVar16;
          }
          while (pHVar12 != (HBondDonor *)0x0) {
            pAVar13 = pHVar12->donorAtom;
            lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar13->super_StuntDouble).storage_);
            lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
            local_13b8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
            pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
            local_13b8[0] = *pdVar1;
            local_13b8[1] = pdVar1[1];
            pAVar13 = pHVar12->donatedHydrogen;
            lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar13->super_StuntDouble).storage_);
            lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
            local_13f8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
            pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
            local_13f8[0] = *pdVar1;
            local_13f8[1] = pdVar1[1];
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_14c8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar19 = 0;
            do {
              (&local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                   (pointer)(local_13f8[lVar19] - local_13b8[lVar19]);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_1458.super_Vector<double,_3U>.data_[2] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1458.super_Vector<double,_3U>.data_[0] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1458.super_Vector<double,_3U>.data_[1] =
                 (double)local_14c8.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            Snapshot::wrapVector(this->currentSnapshot_,&local_1458);
            dVar6 = 0.0;
            lVar19 = 0;
            do {
              dVar20 = local_1458.super_Vector<double,_3U>.data_[lVar19];
              dVar6 = dVar6 + dVar20 * dVar20;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (dVar6 < 0.0) {
              local_14a8 = (pointer)sqrt(dVar6);
            }
            else {
              local_14a8 = (pointer)SQRT(dVar6);
            }
            ppAVar15 = (pMVar10->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            while( true ) {
              if (ppAVar15 ==
                  (pMVar10->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pAVar13 = (Atom *)0x0;
              }
              else {
                pAVar13 = *ppAVar15;
              }
              if (pAVar13 == (Atom *)0x0) break;
              lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar13->super_StuntDouble).storage_);
              lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
              local_13d8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
              pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
              local_13d8[0] = *pdVar1;
              local_13d8[1] = pdVar1[1];
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar19 = 0;
              do {
                (&local_14c8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                     (pointer)(local_13d8[lVar19] - local_13b8[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_1438.super_Vector<double,_3U>.data_[2] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1438.super_Vector<double,_3U>.data_[0] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_1438.super_Vector<double,_3U>.data_[1] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this->currentSnapshot_,&local_1438);
              dVar6 = 0.0;
              lVar19 = 0;
              do {
                dVar20 = local_1438.super_Vector<double,_3U>.data_[lVar19];
                dVar6 = dVar6 + dVar20 * dVar20;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              if (dVar6 < this->OOCut_) {
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar19 = 0;
                do {
                  (&local_14c8.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                       (pointer)(local_13d8[lVar19] - local_13f8[lVar19]);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_1418.super_Vector<double,_3U>.data_[2] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1418.super_Vector<double,_3U>.data_[0] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_1418.super_Vector<double,_3U>.data_[1] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                local_14b0 = (pair<double,_OpenMD::Molecule_*> *)dVar6;
                Snapshot::wrapVector(this->currentSnapshot_,&local_1418);
                dVar6 = 0.0;
                lVar19 = 0;
                do {
                  dVar20 = local_1418.super_Vector<double,_3U>.data_[lVar19];
                  dVar6 = dVar6 + dVar20 * dVar20;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                if (dVar6 < 0.0) {
                  local_14a0 = sqrt(dVar6);
                }
                else {
                  local_14a0 = SQRT(dVar6);
                }
                dVar6 = 0.0;
                lVar19 = 0;
                do {
                  dVar6 = dVar6 + local_1458.super_Vector<double,_3U>.data_[lVar19] *
                                  local_1438.super_Vector<double,_3U>.data_[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                dVar6 = acos(dVar6 / ((double)local_14b0 * (double)local_14a8));
                if (((dVar6 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                   (local_14a0 < this->OHCut_)) {
                  pdVar5 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])
                            (SUB84(pdVar5[pMVar9->globalIndex_],0),pdVar5[pMVar10->globalIndex_],
                             this);
                }
              }
              ppAVar15 = ppAVar15 + 1;
            }
            ppHVar16 = ppHVar16 + 1;
            if (ppHVar16 ==
                (pMVar9->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pHVar12 = (HBondDonor *)0x0;
            }
            else {
              pHVar12 = *ppHVar16;
            }
          }
          local_14a8 = (pMVar9->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          if (local_14a8 ==
              (pMVar9->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar13 = (Atom *)0x0;
          }
          else {
            pAVar13 = *local_14a8;
          }
          while (uVar18 = local_1468, pAVar13 != (Atom *)0x0) {
            lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar13->super_StuntDouble).storage_);
            lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
            local_13d8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
            pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
            local_13d8[0] = *pdVar1;
            local_13d8[1] = pdVar1[1];
            ppHVar16 = (pMVar10->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              if (ppHVar16 ==
                  (pMVar10->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pHVar12 = (HBondDonor *)0x0;
              }
              else {
                pHVar12 = *ppHVar16;
              }
              if (pHVar12 == (HBondDonor *)0x0) break;
              pAVar13 = pHVar12->donorAtom;
              lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar13->super_StuntDouble).storage_);
              lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
              local_13b8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
              pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
              local_13b8[0] = *pdVar1;
              local_13b8[1] = pdVar1[1];
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_14c8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar19 = 0;
              do {
                (&local_14c8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                     (pointer)(local_13d8[lVar19] - local_13b8[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_1438.super_Vector<double,_3U>.data_[2] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1438.super_Vector<double,_3U>.data_[0] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_1438.super_Vector<double,_3U>.data_[1] =
                   (double)local_14c8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this->currentSnapshot_,&local_1438);
              dVar6 = 0.0;
              lVar19 = 0;
              do {
                dVar20 = local_1438.super_Vector<double,_3U>.data_[lVar19];
                dVar6 = dVar6 + dVar20 * dVar20;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              if (dVar6 < 0.0) {
                local_14b0 = (pair<double,_OpenMD::Molecule_*> *)sqrt(dVar6);
              }
              else {
                local_14b0 = (pair<double,_OpenMD::Molecule_*> *)SQRT(dVar6);
              }
              if ((double)local_14b0 < this->OOCut_) {
                pAVar13 = pHVar12->donatedHydrogen;
                lVar19 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar13->super_StuntDouble).storage_);
                lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
                local_13f8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar14 * 0x18);
                pdVar1 = (double *)(lVar19 + lVar14 * 0x18);
                local_13f8[0] = *pdVar1;
                local_13f8[1] = pdVar1[1];
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar19 = 0;
                do {
                  (&local_14c8.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                       (pointer)(local_13d8[lVar19] - local_13f8[lVar19]);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_1418.super_Vector<double,_3U>.data_[2] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1418.super_Vector<double,_3U>.data_[0] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_1418.super_Vector<double,_3U>.data_[1] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                Snapshot::wrapVector(this->currentSnapshot_,&local_1418);
                dVar6 = 0.0;
                lVar19 = 0;
                do {
                  dVar20 = local_1418.super_Vector<double,_3U>.data_[lVar19];
                  dVar6 = dVar6 + dVar20 * dVar20;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                if (dVar6 < 0.0) {
                  local_14a0 = sqrt(dVar6);
                }
                else {
                  local_14a0 = SQRT(dVar6);
                }
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_14c8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar19 = 0;
                do {
                  (&local_14c8.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                       (pointer)(local_13f8[lVar19] - local_13b8[lVar19]);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_1458.super_Vector<double,_3U>.data_[2] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1458.super_Vector<double,_3U>.data_[0] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_1458.super_Vector<double,_3U>.data_[1] =
                     (double)local_14c8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                Snapshot::wrapVector(this->currentSnapshot_,&local_1458);
                dVar6 = 0.0;
                lVar19 = 0;
                do {
                  dVar20 = local_1458.super_Vector<double,_3U>.data_[lVar19];
                  dVar6 = dVar6 + dVar20 * dVar20;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                if (dVar6 < 0.0) {
                  dVar6 = sqrt(dVar6);
                }
                else {
                  dVar6 = SQRT(dVar6);
                }
                dVar20 = 0.0;
                lVar19 = 0;
                do {
                  dVar20 = dVar20 + local_1458.super_Vector<double,_3U>.data_[lVar19] *
                                    local_1438.super_Vector<double,_3U>.data_[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                dVar6 = acos(dVar20 / ((double)local_14b0 * dVar6));
                if (((dVar6 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                   (local_14a0 < this->OHCut_)) {
                  pdVar5 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])
                            (SUB84(pdVar5[pMVar10->globalIndex_],0),pdVar5[pMVar9->globalIndex_],
                             this);
                }
              }
              ppHVar16 = ppHVar16 + 1;
            }
            local_14a8 = local_14a8 + 1;
            if (local_14a8 ==
                (pMVar9->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar13 = (Atom *)0x0;
            }
            else {
              pAVar13 = *local_14a8;
            }
          }
          pMVar10 = SelectionManager::nextSelectedMolecule(local_1490,&local_143c);
        }
        pMVar9 = SelectionManager::nextSelectedMolecule(local_1490,&local_1494);
      }
      uVar17 = (int)uVar18 + (this->super_StaticAnalyser).step_;
      uVar18 = (ulong)uVar17;
    } while ((int)uVar17 < local_1440);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[3])(this);
  DumpReader::~DumpReader(&local_1288);
  if (local_1488 != (pair<double,_OpenMD::Molecule_*> *)0x0) {
    operator_delete(local_1488,(long)local_1478 - (long)local_1488);
  }
  return;
}

Assistant:

void TetrahedralityHBMatrix::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* moli;
    Molecule* molj;
    SimInfo::MoleculeIterator mi;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj, dposition, tposition;
    RealType r, cospsi;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta, Qk, q1, q2;
    std::vector<std::pair<RealType, Molecule*>> myNeighbors;
    int myIndex, ii, jj, index1, index2;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Q_.clear();
      Q_.resize(info_->getNGlobalMolecules(), 0.0);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected Molecules:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        myIndex = mol1->getGlobalIndex();

        Qk = 1.0;

        myNeighbors.clear();

        // inner loop is over all Molecules in the system:

        for (mol2 = info_->beginMolecule(mi); mol2 != NULL;
             mol2 = info_->nextMolecule(mi)) {
          if (mol2->getGlobalIndex() != myIndex) {
            vec = mol1->getCom() - mol2->getCom();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, mol2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:
        // int nbors =  myNeighbors.size()> 4 ? 4 : myNeighbors.size();
        int nbors = myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = mol1->getCom();

        for (int i = 0; i < nbors - 1; i++) {
          moli = myNeighbors[i].second;
          ri   = moli->getCom();
          rik  = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            molj = myNeighbors[j].second;
            rj   = molj->getCom();
            rkj  = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from the actual number of nearest neighbors.
            Qk = Qk - (pow(cospsi + 1.0 / 3.0, 2) * 9.0 / (4.0 * nang));
          }
        }

        if (nang > 0) { Q_[myIndex] = Qk; }
      }
      // Now to scan for histogram:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        for (mol2 = seleMan_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
                 hba = mol2->nextHBondAcceptor(hbai)) {
              aPos = hba->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                HA = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  index1 = mol1->getGlobalIndex();
                  index2 = mol2->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
          // now loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
                 hbd = mol2->nextHBondDonor(hbdi)) {
              dPos = hbd->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                hPos = hbd->donatedHydrogen->getPos();
                HA   = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                DH = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  // keep these indexed by donor then acceptor:
                  index1 = mol2->getGlobalIndex();
                  index2 = mol1->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
        }
      }
    }
    writeOutput();
  }